

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<long_double_*>::TPZVec(TPZVec<long_double_*> *this,TPZVec<long_double_*> *copy)

{
  ulong uVar1;
  longdouble **pplVar2;
  ulong uVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b570;
  this->fStore = (longdouble **)0x0;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 1) {
    pplVar2 = (longdouble **)0x0;
  }
  else {
    pplVar2 = (longdouble **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  }
  this->fStore = pplVar2;
  if (0 < (long)uVar1) {
    uVar3 = 0;
    do {
      this->fStore[uVar3] = copy->fStore[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  this->fNElements = uVar1;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}